

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

Time absl::FromUniversal(int64_t universal)

{
  undefined8 uVar1;
  undefined4 uVar2;
  Duration *pDVar3;
  long lVar4;
  Time TVar5;
  Duration rhs;
  Duration local_18;
  
  lVar4 = universal % 1000000000;
  local_18.rep_hi_ = (lVar4 >> 0x3d) + universal / 1000000000;
  local_18.rep_lo_ = (int)lVar4 * 4 + 4000000000;
  if (-1 < lVar4) {
    local_18.rep_lo_ = (int)lVar4 * 4;
  }
  pDVar3 = Duration::operator*=(&local_18,100);
  uVar1 = pDVar3->rep_hi_;
  uVar2 = pDVar3->rep_lo_;
  rhs.rep_lo_ = uVar2;
  rhs.rep_hi_ = uVar1;
  local_18.rep_hi_ = -0xe7791f700;
  local_18.rep_lo_ = 0;
  rhs._12_4_ = 0;
  Duration::operator+=(&local_18,rhs);
  TVar5.rep_.rep_lo_ = local_18.rep_lo_;
  TVar5.rep_.rep_hi_ = local_18.rep_hi_;
  TVar5.rep_._12_4_ = 0;
  return (Time)TVar5.rep_;
}

Assistant:

absl::Time FromUniversal(int64_t universal) {
  return absl::UniversalEpoch() + 100 * absl::Nanoseconds(universal);
}